

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_01;
  TargetDependSet *pTVar3;
  _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  *__x;
  _Base_ptr p_Var4;
  pointer ppcVar5;
  pointer ppcVar6;
  set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
  depVisited;
  _Alloc_hider in_stack_ffffffffffffff70;
  undefined1 local_88 [40];
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_60;
  cmGlobalUnixMakefileGenerator3 *local_48;
  pointer local_40;
  pointer local_38;
  
  bVar2 = cmake::GetIsInTryCompile
                    (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                     CMakeInstance);
  if (!bVar2) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff70,"CMAKE_COLOR_MAKEFILE",
               (allocator<char> *)&local_60);
    bVar2 = cmMakefile::IsSet(pcVar1,(string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff70,"CMAKE_COLOR_MAKEFILE",
                 (allocator<char> *)&local_60);
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)&stack0xffffffffffffff70);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff70,"CMAKE_COLOR_DIAGNOSTICS",
                 (allocator<char> *)&local_60);
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)&stack0xffffffffffffff70);
    }
    this->ColorMakefile = bVar2;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff70,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES",
             (allocator<char> *)&local_60);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&stack0xffffffffffffff70);
  this->SkipPreprocessedSourceRules = bVar2;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff70,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES",
             (allocator<char> *)&local_60);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&stack0xffffffffffffff70);
  this->SkipAssemblySourceRules = bVar2;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  local_48 = (cmGlobalUnixMakefileGenerator3 *)
             (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  cmGlobalGenerator::GetLocalGeneratorTargetsInOrder
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_60,
             (cmGlobalGenerator *)local_48,(cmLocalGenerator *)this);
  local_40 = local_60._M_impl.super__Vector_impl_data._M_finish;
  ppcVar6 = local_60._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar5 = local_60._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar6;
      ppcVar5 = ppcVar5 + 1) {
    this_00 = *ppcVar5;
    bVar2 = cmGeneratorTarget::IsInBuildSystem(this_00);
    if (bVar2) {
      this_01 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 *)GetCommandsVisited(this,this_00);
      local_38 = ppcVar5;
      pTVar3 = cmGlobalGenerator::GetTargetDirectDepends
                         ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          GlobalGenerator,this_00);
      for (p_Var4 = (pTVar3->
                    super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                    )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 !=
          &(pTVar3->
           super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
           _M_t._M_impl.super__Rb_tree_header; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4))
      {
        __x = &GetCommandsVisited(this,*(cmGeneratorTarget **)(p_Var4 + 1))->_M_t;
        std::
        _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
        ::_Rb_tree((_Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                    *)&stack0xffffffffffffff70,__x);
        std::
        _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmSourceFile_const*>>
                  (this_01,(_Rb_tree_const_iterator<const_cmSourceFile_*>)local_88._16_8_,
                   (_Base_ptr)local_88);
        std::
        _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
        ::~_Rb_tree((_Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
                     *)&stack0xffffffffffffff70);
      }
      cmMakefileTargetGenerator::New((cmGeneratorTarget *)in_stack_ffffffffffffff70._M_p);
      ppcVar5 = local_38;
      ppcVar6 = local_40;
      if ((cmGeneratorTarget *)in_stack_ffffffffffffff70._M_p != (cmGeneratorTarget *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffff70._M_p + 0x18))();
        cmGlobalUnixMakefileGenerator3::RecordTargetProgress
                  (local_48,(cmMakefileTargetGenerator *)in_stack_ffffffffffffff70._M_p);
        if ((cmGeneratorTarget *)in_stack_ffffffffffffff70._M_p != (cmGeneratorTarget *)0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffff70._M_p + 8))();
        }
      }
    }
  }
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&local_60);
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    if (this->Makefile->IsSet("CMAKE_COLOR_MAKEFILE")) {
      this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
    } else {
      this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_DIAGNOSTICS");
    }
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (cmGeneratorTarget* gt :
       this->GlobalGenerator->GetLocalGeneratorTargetsInOrder(this)) {
    if (!gt->IsInBuildSystem()) {
      continue;
    }

    auto& gtVisited = this->GetCommandsVisited(gt);
    const auto& deps = this->GlobalGenerator->GetTargetDirectDepends(gt);
    for (const auto& d : deps) {
      // Take the union of visited source files of custom commands
      auto depVisited = this->GetCommandsVisited(d);
      gtVisited.insert(depVisited.begin(), depVisited.end());
    }

    std::unique_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(gt));
    if (tg) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}